

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void csrPrintDense(char *s,CUPDLPcsr *csr)

{
  int *in_RSI;
  undefined8 in_RDI;
  cupdlp_int i;
  cupdlp_int iElem;
  cupdlp_int iRow;
  cupdlp_int deltaCol;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  printf("------------------------------------------------\n");
  printf("%s:\n",in_RDI);
  for (local_18 = 0; local_18 < *in_RSI; local_18 = local_18 + 1) {
    local_1c = *(int *)(*(long *)(in_RSI + 4) + (long)local_18 * 4);
    while( true ) {
      if (*(int *)(*(long *)(in_RSI + 4) + (long)(local_18 + 1) * 4) <= local_1c) break;
      if (local_1c == *(int *)(*(long *)(in_RSI + 4) + (long)local_18 * 4)) {
        local_14 = *(int *)(*(long *)(in_RSI + 6) + (long)local_1c * 4);
      }
      else {
        local_14 = (*(int *)(*(long *)(in_RSI + 6) + (long)local_1c * 4) -
                   *(int *)(*(long *)(in_RSI + 6) + (long)(local_1c + -1) * 4)) + -1;
      }
      for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
        printf("       ");
      }
      printf("%6.3f ",*(undefined8 *)(*(long *)(in_RSI + 8) + (long)local_1c * 8));
      local_1c = local_1c + 1;
    }
    printf("\n");
  }
  printf("------------------------------------------------\n");
  return;
}

Assistant:

void csrPrintDense(const char *s, CUPDLPcsr *csr) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s:\n", s);
  cupdlp_int deltaCol = 0;
  for (cupdlp_int iRow = 0; iRow < csr->nRows; ++iRow) {
    for (cupdlp_int iElem = csr->rowMatBeg[iRow];
         iElem < csr->rowMatBeg[iRow + 1]; ++iElem) {
      if (iElem == csr->rowMatBeg[iRow])
        deltaCol = csr->rowMatIdx[iElem];
      else
        deltaCol = csr->rowMatIdx[iElem] - csr->rowMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaCol; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csr->rowMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}